

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

void __thiscall
google::protobuf::io::Printer::Annotate
          (Printer *this,string_view begin_varname,string_view end_varname,string_view file_name,
          optional<google::protobuf::io::AnnotationCollector::Semantic> semantic)

{
  string_view file_path;
  string_view end_varname_00;
  string_view begin_varname_00;
  vector<int,_std::allocator<int>_> local_88;
  size_t local_68;
  char *pcStack_60;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_58;
  char *pcStack_50;
  size_t local_48;
  char *pcStack_40;
  Printer *local_38;
  Printer *this_local;
  optional<google::protobuf::io::AnnotationCollector::Semantic> semantic_local;
  string_view end_varname_local;
  string_view begin_varname_local;
  
  pcStack_50 = end_varname._M_str;
  local_58 = (_Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>)
             end_varname._M_len;
  pcStack_40 = begin_varname._M_str;
  local_48 = begin_varname._M_len;
  if ((this->options_).annotation_collector != (AnnotationCollector *)0x0) {
    local_68 = file_name._M_len;
    pcStack_60 = file_name._M_str;
    local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_38 = this;
    this_local = (Printer *)
                 semantic.
                 super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>;
    semantic_local.
    super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>._M_payload
    .super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> =
         (_Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>)
         (_Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>)local_58;
    std::vector<int,_std::allocator<int>_>::vector(&local_88);
    begin_varname_00._M_str = pcStack_40;
    begin_varname_00._M_len = local_48;
    end_varname_00._M_str = pcStack_50;
    end_varname_00._M_len._0_4_ = local_58._M_payload;
    end_varname_00._M_len._4_1_ = local_58._M_engaged;
    end_varname_00._M_len._5_3_ = local_58._5_3_;
    file_path._M_str = pcStack_60;
    file_path._M_len = local_68;
    Annotate(this,begin_varname_00,end_varname_00,file_path,&local_88,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)this_local);
    std::vector<int,_std::allocator<int>_>::~vector(&local_88);
  }
  return;
}

Assistant:

void Annotate(
      absl::string_view begin_varname, absl::string_view end_varname,
      absl::string_view file_name,
      absl::optional<AnnotationCollector::Semantic> semantic = absl::nullopt) {
    if (options_.annotation_collector == nullptr) {
      return;
    }

    Annotate(begin_varname, end_varname, file_name, {}, semantic);
  }